

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

void __thiscall ktx::ValidationContext::validateCreateAndTranscode(ValidationContext *this)

{
  __optional_eq_t<_khr_df_model_e,__khr_df_model_e> _Var1;
  ktxTexture2 **ppkVar2;
  ktxTexture2 *pkVar3;
  char **in_RDI;
  IssueFatal *unaff_retaddr;
  ValidationContext *in_stack_00000008;
  IssueWarning *in_stack_00000040;
  ValidationContext *in_stack_00000048;
  ktx_error_code_e result;
  ktxTextureCreateFlags flags;
  KTXTexture2 texture;
  _khr_df_model_e *in_stack_fffffffffffffef8;
  KTXTexture2 *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff60;
  khr_df_model_e model;
  string local_90 [32];
  undefined4 in_stack_ffffffffffffff90;
  undefined4 uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  IssueError *in_stack_ffffffffffffffa0;
  ValidationContext *in_stack_ffffffffffffffa8;
  IssueError *in_stack_ffffffffffffffb0;
  ValidationContext *in_stack_ffffffffffffffb8;
  ktxSupercmpScheme in_stack_ffffffffffffffc4;
  int local_18;
  undefined4 local_14;
  KTXTexture2 local_10;
  char **args;
  
  model = (khr_df_model_e)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  args = in_RDI;
  KTXTexture2::KTXTexture2(&local_10,(nullptr_t)0x0);
  local_14 = 1;
  if ((*(byte *)((long)in_RDI + 0x29) & 1) != 0) {
    local_14 = 9;
  }
  ppkVar2 = KTXTexture2::pHandle(&local_10);
  local_18 = (**(code **)(*in_RDI + 0x18))(in_RDI,local_14,ppkVar2);
  if ((*(int *)(in_RDI + 6) == 0) && (*(int *)((long)in_RDI + 0x34) == 0)) {
    switch(local_18) {
    case 0:
      uVar4 = 0xa3;
      _Var1 = std::operator==((optional<_khr_df_model_e> *)in_stack_ffffffffffffff00,
                              in_stack_fffffffffffffef8);
      if (_Var1) {
        pkVar3 = KTXTexture2::handle(&local_10);
        local_18 = ktxTexture2_TranscodeBasis(pkVar3,1,0);
      }
      else {
        in_stack_ffffffffffffff90 = 0xa6;
        _Var1 = std::operator==((optional<_khr_df_model_e> *)in_stack_ffffffffffffff00,
                                in_stack_fffffffffffffef8);
        if (_Var1) {
          pkVar3 = KTXTexture2::handle(&local_10);
          local_18 = ktxTexture2_TranscodeBasis(pkVar3,10,0);
        }
      }
      if (local_18 != 0) {
        std::optional<_khr_df_model_e>::operator*((optional<_khr_df_model_e> *)0x2b5490);
        toString_abi_cxx11_(model);
        in_stack_ffffffffffffff00 = (KTXTexture2 *)ktxErrorString(local_18);
        error<std::__cxx11::string,char_const*>
                  (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                   (char **)CONCAT44(uVar4,in_stack_ffffffffffffff90));
        std::__cxx11::string::~string(local_90);
      }
      break;
    default:
      ktxErrorString(local_18);
      fatal<char_const*>(in_stack_00000008,unaff_retaddr,args);
      break;
    case 0x11:
      warning<>(in_stack_00000048,in_stack_00000040);
      break;
    case 0x13:
      toString_abi_cxx11_(in_stack_ffffffffffffffc4);
      error<std::__cxx11::string>
                (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffffa8);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
      break;
    case 0x14:
      toString_abi_cxx11_(in_stack_ffffffffffffffc4);
      error<std::__cxx11::string>
                (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffffa8);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
    }
  }
  else if ((local_18 == 0) && (*(int *)(in_RDI + 6) != 0)) {
    warning<>(in_stack_00000048,in_stack_00000040);
  }
  KTXTexture2::~KTXTexture2(in_stack_ffffffffffffff00);
  return;
}

Assistant:

void ValidationContext::validateCreateAndTranscode() {
    KTXTexture2 texture{nullptr};
    ktxTextureCreateFlags flags = KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT;

    if (checkGLTFBasisU)
        flags |= KTX_TEXTURE_CREATE_CHECK_GLTF_BASISU_BIT;

    ktx_error_code_e result = createKTXTexture(flags, texture.pHandle());

    if (numError == 0 && numWarning == 0) {
        switch (result) {
        case KTX_UNSUPPORTED_FEATURE:
            warning(Validator::UnsupportedFeature);
            break;

        case KTX_DECOMPRESS_LENGTH_ERROR:
            error(LevelIndex::UncompressedByteLengthMismatch,
                    toString(ktxSupercmpScheme(header.supercompressionScheme)));
            break;

        case KTX_DECOMPRESS_CHECKSUM_ERROR:
            error(Validator::DecompressChecksumError,
                    toString(ktxSupercmpScheme(header.supercompressionScheme)));
            break;

        case KTX_SUCCESS:
            if (parsedColorModel == KHR_DF_MODEL_ETC1S)
                result = ktxTexture2_TranscodeBasis(texture.handle(), KTX_TTF_ETC2_RGBA, 0);
            else if (parsedColorModel == KHR_DF_MODEL_UASTC)
                result = ktxTexture2_TranscodeBasis(texture.handle(), KTX_TTF_ASTC_4x4_RGBA, 0);

            if (result != KTX_SUCCESS)
                error(Validator::TranscodeFailure, toString(*parsedColorModel), ktxErrorString(result));
            break;

        default:
            fatal(Validator::CreateFailure, ktxErrorString(result));
            break;
        }
    } else if (result == KTX_SUCCESS && numError != 0) {
        warning(Validator::SupportedNonConformantFile);
    }
}